

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool metaf::TrendGroup::canCombineTime(TrendGroup *g1,TrendGroup *g2)

{
  bool bVar1;
  TrendGroup *in_RSI;
  TrendGroup *in_RDI;
  bool local_10f;
  bool local_10e;
  bool local_10d;
  bool local_10c;
  bool local_10b;
  bool local_10a;
  bool local_109;
  optional<metaf::MetafTime> local_108;
  optional<metaf::MetafTime> local_f4;
  optional<metaf::MetafTime> local_e0;
  optional<metaf::MetafTime> local_cc;
  optional<metaf::MetafTime> local_b8;
  optional<metaf::MetafTime> local_a4;
  optional<metaf::MetafTime> local_90;
  optional<metaf::MetafTime> local_7c;
  optional<metaf::MetafTime> local_68;
  optional<metaf::MetafTime> local_54;
  optional<metaf::MetafTime> local_40;
  optional<metaf::MetafTime> local_2c;
  TrendGroup *local_18;
  TrendGroup *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  timeFrom(&local_2c,in_RDI);
  bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x2411c9);
  local_109 = false;
  if (bVar1) {
    timeFrom(&local_40,local_18);
    local_109 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x2411fa);
  }
  if (local_109 == false) {
    timeUntil(&local_54,local_10);
    bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241237);
    local_10a = false;
    if (bVar1) {
      timeUntil(&local_68,local_18);
      local_10a = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241268)
      ;
    }
    if (local_10a == false) {
      timeAt(&local_7c,local_10);
      bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x2412a5);
      local_10b = false;
      if (bVar1) {
        timeAt(&local_90,local_18);
        local_10b = std::optional<metaf::MetafTime>::has_value
                              ((optional<metaf::MetafTime> *)0x2412d6);
      }
      if (local_10b == false) {
        timeAt(&local_a4,local_10);
        bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x24130d);
        local_10c = false;
        if (bVar1) {
          timeFrom(&local_b8,local_18);
          bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241338)
          ;
          local_10d = true;
          if (!bVar1) {
            timeUntil(&local_cc,local_18);
            local_10d = std::optional<metaf::MetafTime>::has_value
                                  ((optional<metaf::MetafTime> *)0x241361);
          }
          local_10c = local_10d;
        }
        if (local_10c == false) {
          timeAt(&local_e0,local_18);
          bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x2413a0)
          ;
          local_10e = false;
          if (bVar1) {
            timeFrom(&local_f4,local_10);
            bVar1 = std::optional<metaf::MetafTime>::has_value
                              ((optional<metaf::MetafTime> *)0x2413cb);
            local_10f = true;
            if (!bVar1) {
              timeUntil(&local_108,local_10);
              local_10f = std::optional<metaf::MetafTime>::has_value
                                    ((optional<metaf::MetafTime> *)0x2413f4);
            }
            local_10e = local_10f;
          }
          if (local_10e == false) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TrendGroup::canCombineTime(const TrendGroup & g1, const TrendGroup & g2) {
	// Cannot combine time 'from' with 'from', 'till' with 'till', 'at' with 'at'
	if (g1.timeFrom().has_value() && g2.timeFrom().has_value()) return false;
	if (g1.timeUntil().has_value() && g2.timeUntil().has_value()) return false;
	if (g1.timeAt().has_value() && g2.timeAt().has_value()) return false;
	// Cannot combine time 'from' or 'till' with 'at'
	if (g1.timeAt().has_value() &&
	       (g2.timeFrom().has_value() || g2.timeUntil().has_value())) return false;
	if (g2.timeAt().has_value() &&
	       (g1.timeFrom().has_value() || g1.timeUntil().has_value())) return false;
	return true;	
}